

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O1

void ncnn_net_register_custom_layer_by_type
               (ncnn_net_t net,char *type,ncnn_layer_creator_t creator,
               ncnn_layer_destroyer_t destroyer,void *userdata)

{
  ncnn_net_custom_layer_factory_t_conflict userdata_00;
  
  userdata_00 = (ncnn_net_custom_layer_factory_t_conflict)malloc(0x20);
  userdata_00->creator = creator;
  userdata_00->destroyer = destroyer;
  userdata_00->userdata = userdata;
  userdata_00->next = net->custom_layer_factory;
  net->custom_layer_factory = userdata_00;
  ncnn::Net::register_custom_layer
            ((Net *)net->pthis,type,__Layer_c_api_layer_creator,__Layer_c_api_layer_destroyer,
             userdata_00);
  return;
}

Assistant:

void ncnn_net_register_custom_layer_by_type(ncnn_net_t net, const char* type, ncnn_layer_creator_t creator, ncnn_layer_destroyer_t destroyer, void* userdata)
{
    ncnn_net_custom_layer_factory_t ud = (ncnn_net_custom_layer_factory_t)malloc(sizeof(struct __ncnn_net_custom_layer_factory_t));
    ud->creator = creator;
    ud->destroyer = destroyer;
    ud->userdata = userdata;
    ud->next = net->custom_layer_factory;
    net->custom_layer_factory = ud;
    ((Net*)net->pthis)->register_custom_layer(type, __Layer_c_api_layer_creator, __Layer_c_api_layer_destroyer, (void*)ud);
}